

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

void google::protobuf::internal::MapMergeFrom<int,proto2_nofieldpresence_unittest::ForeignMessage>
               (Map<int,_proto2_nofieldpresence_unittest::ForeignMessage> *dest,
               Map<int,_proto2_nofieldpresence_unittest::ForeignMessage> *src)

{
  uint uVar1;
  ulong uVar2;
  ForeignMessage *this;
  NodeBase *pNVar3;
  pair<google::protobuf::Map<int,_proto2_nofieldpresence_unittest::ForeignMessage>::iterator,_bool>
  local_50;
  
  uVar1 = (src->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.index_of_first_non_null_;
  uVar2 = (ulong)uVar1;
  if (uVar1 == (src->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.num_buckets_) {
    return;
  }
  pNVar3 = (src->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.table_[uVar2];
  if (pNVar3 != (NodeBase *)0x0) {
    do {
      do {
        Map<int,proto2_nofieldpresence_unittest::ForeignMessage>::TryEmplaceInternal<int_const&>
                  (&local_50,dest,(int *)(pNVar3 + 1));
        if (pNVar3 != local_50.first.super_UntypedMapIterator.node_) {
          this = (ForeignMessage *)(local_50.first.super_UntypedMapIterator.node_ + 2);
          proto2_nofieldpresence_unittest::ForeignMessage::Clear(this);
          proto2_nofieldpresence_unittest::ForeignMessage::MergeImpl
                    ((MessageLite *)this,(MessageLite *)(pNVar3 + 2));
        }
        pNVar3 = pNVar3->next;
      } while (pNVar3 != (NodeBase *)0x0);
      do {
        uVar1 = (int)uVar2 + 1;
        uVar2 = (ulong)uVar1;
        if ((src->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.num_buckets_ <= uVar1) {
          return;
        }
        pNVar3 = (src->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.table_[uVar1];
      } while (pNVar3 == (NodeBase *)0x0);
    } while( true );
  }
  protobuf_assumption_failed
            ("node != nullptr",
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
             ,0x22e);
}

Assistant:

inline UntypedMapIterator UntypedMapBase::begin() const {
  map_index_t bucket_index;
  NodeBase* node;
  if (index_of_first_non_null_ == num_buckets_) {
    bucket_index = 0;
    node = nullptr;
  } else {
    bucket_index = index_of_first_non_null_;
    node = table_[bucket_index];
    PROTOBUF_ASSUME(node != nullptr);
  }
  return UntypedMapIterator{node, this, bucket_index};
}